

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

Scalar RigidBodyDynamics::Utils::CalcKineticEnergy
                 (Model *model,VectorNd *q,VectorNd *qdot,bool update_kinematics)

{
  undefined7 in_register_00000009;
  long lVar1;
  SpatialVector *mv;
  size_t i;
  ulong uVar2;
  long lVar3;
  Scalar SVar4;
  Scalar SVar5;
  dense_product_base local_98 [16];
  undefined8 local_88;
  SpatialVector *local_80;
  SpatialVector *local_70;
  SpatialVector local_68;
  
  if ((int)CONCAT71(in_register_00000009,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,q,qdot,(VectorNd *)0x0);
  }
  SVar4 = 0.0;
  lVar1 = 0x50;
  lVar3 = 0x30;
  for (uVar2 = 1;
      uVar2 < (ulong)(((long)(model->mBodies).
                             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(model->mBodies).
                            super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            .
                            super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x70); uVar2 = uVar2 + 1) {
    mv = (SpatialVector *)
         ((long)&(((model->v).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start)->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar3);
    Math::SpatialRigidBodyInertia::operator*
              (&local_68,
               (SpatialRigidBodyInertia *)
               ((long)&(((model->I).
                         super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                         ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d + lVar1 + -8)
               ,mv);
    local_88 = 0x3fe0000000000000;
    local_80 = mv;
    local_70 = &local_68;
    SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(local_98);
    SVar4 = SVar4 + SVar5;
    lVar1 = lVar1 + 0x50;
    lVar3 = lVar3 + 0x30;
  }
  return SVar4;
}

Assistant:

RBDL_DLLAPI Scalar CalcKineticEnergy (
  Model &model,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot,
  bool update_kinematics)
{
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &q, &qdot, NULL);
  }

  Scalar result = 0.;

  for (size_t i = 1; i < model.mBodies.size(); i++) {
    result += 0.5 * model.v[i].transpose() * (model.I[i] * model.v[i]);
  }
  return result;
}